

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O1

big_integer *
anon_unknown.dwarf_be5a::extract_random_element<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  pointer pbVar1;
  int iVar2;
  ulong uVar3;
  big_integer *pbVar4;
  big_integer *other;
  big_integer bStack_58;
  
  iVar2 = rand();
  pbVar1 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)(long)iVar2 %
          (ulong)(((long)(v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pbVar1 >> 3) * 0x6db6db6db6db6db7
                 );
  big_integer::big_integer(__return_storage_ptr__,pbVar1 + uVar3);
  other = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
          super__Vector_impl_data._M_start + uVar3;
  pbVar4 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish + -1;
  big_integer::big_integer(&bStack_58,pbVar4);
  big_integer::operator=(pbVar4,other);
  big_integer::operator=(other,&bStack_58);
  big_integer::~big_integer(&bStack_58);
  pbVar4 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.super__Vector_impl_data
  ._M_finish = pbVar4;
  big_integer::~big_integer(pbVar4);
  return __return_storage_ptr__;
}

Assistant:

T extract_random_element(std::vector<T>& v)
    {
        size_t index = rand() % v.size();
        T copy = v[index];
        erase_unordered(v, v.begin() + index);
        return copy;
    }